

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O0

u_char * ngx_strcasestrn(u_char *s1,char *s2,size_t n)

{
  ngx_int_t nVar1;
  u_char *s1_00;
  ulong local_48;
  ulong local_40;
  ngx_uint_t c2;
  ngx_uint_t c1;
  size_t n_local;
  char *s2_local;
  u_char *s1_local;
  
  local_40 = (ulong)*s2;
  s1_00 = s1;
  if ((0x40 < local_40) && (s1_00 = s1, local_40 < 0x5b)) {
    local_40 = local_40 | 0x20;
    s1_00 = s1;
  }
  do {
    s2_local = (char *)s1_00;
    s1_00 = (u_char *)(s2_local + 1);
    local_48 = (ulong)(byte)*s2_local;
    if (local_48 == 0) {
      return (u_char *)0x0;
    }
    if ((0x40 < local_48) && (local_48 < 0x5b)) {
      local_48 = local_48 | 0x20;
    }
  } while ((local_48 != local_40) ||
          (nVar1 = ngx_strncasecmp(s1_00,(u_char *)(s2 + 1),n), nVar1 != 0));
  return (u_char *)s2_local;
}

Assistant:

u_char *
ngx_strcasestrn(u_char *s1, char *s2, size_t n)
{
    ngx_uint_t  c1, c2;

    c2 = (ngx_uint_t) *s2++;
    c2 = (c2 >= 'A' && c2 <= 'Z') ? (c2 | 0x20) : c2;

    do {
        do {
            c1 = (ngx_uint_t) *s1++;

            if (c1 == 0) {
                return NULL;
            }

            c1 = (c1 >= 'A' && c1 <= 'Z') ? (c1 | 0x20) : c1;

        } while (c1 != c2);

    } while (ngx_strncasecmp(s1, (u_char *) s2, n) != 0);

    return --s1;
}